

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

double __thiscall
duckdb::Interpolator<false>::
Interpolate<unsigned_long,double,duckdb::QuantileIndirect<duckdb::hugeint_t>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<duckdb::hugeint_t> *accessor)

{
  DataChunk *pDVar1;
  CURSOR *pCVar2;
  TryCast *pTVar3;
  uint64_t uVar4;
  bool bVar5;
  bool bVar6;
  reference pvVar7;
  InvalidInputException *pIVar8;
  int64_t iVar9;
  undefined1 strict;
  uint uVar10;
  double dVar11;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t input_02;
  hugeint_t input_03;
  hugeint_t input_04;
  double result_1;
  double local_60;
  string local_58;
  double local_38;
  
  strict = SUB81(accessor,0);
  pCVar2 = accessor->data;
  bVar5 = (pCVar2->scan).next_row_index <= lidx;
  bVar6 = lidx < (pCVar2->scan).current_row_index;
  if (lidx == hidx) {
    if (bVar6 || bVar5) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,lidx,&pCVar2->scan,pDVar1);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (hugeint_t *)pvVar7->data;
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar7);
      pCVar2->validity = &pvVar7->validity;
    }
    uVar10 = (int)lidx - (int)(pCVar2->scan).current_row_index;
    pTVar3 = (TryCast *)pCVar2->data[uVar10].lower;
    uVar4 = pCVar2->data[uVar10].upper;
    iVar9 = 0;
    input.upper = (int64_t)&local_60;
    input.lower = uVar4;
    bVar6 = TryCast::Operation<duckdb::hugeint_t,double>(pTVar3,input,(double *)0x0,(bool)strict);
    if (!bVar6) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_02.upper = iVar9;
      input_02.lower = uVar4;
      CastExceptionText<duckdb::hugeint_t,double>(&local_58,(duckdb *)pTVar3,input_02);
      InvalidInputException::InvalidInputException(pIVar8,(string *)&local_58);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    if (bVar6 || bVar5) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,lidx,&pCVar2->scan,pDVar1);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (hugeint_t *)pvVar7->data;
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar7);
      pCVar2->validity = &pvVar7->validity;
    }
    uVar10 = (int)lidx - (int)(pCVar2->scan).current_row_index;
    pTVar3 = (TryCast *)pCVar2->data[uVar10].lower;
    uVar4 = pCVar2->data[uVar10].upper;
    iVar9 = 0;
    input_00.upper = (int64_t)&local_60;
    input_00.lower = uVar4;
    bVar6 = TryCast::Operation<duckdb::hugeint_t,double>(pTVar3,input_00,(double *)0x0,(bool)strict)
    ;
    if (!bVar6) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_03.upper = iVar9;
      input_03.lower = uVar4;
      CastExceptionText<duckdb::hugeint_t,double>(&local_58,(duckdb *)pTVar3,input_03);
      InvalidInputException::InvalidInputException(pIVar8,(string *)&local_58);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_38 = local_60;
    pCVar2 = accessor->data;
    if (((pCVar2->scan).next_row_index <= hidx) || (hidx < (pCVar2->scan).current_row_index)) {
      pDVar1 = &pCVar2->page;
      ColumnDataCollection::Seek(pCVar2->inputs,hidx,&pCVar2->scan,pDVar1);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar2->data = (hugeint_t *)pvVar7->data;
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar7);
      pCVar2->validity = &pvVar7->validity;
    }
    uVar10 = (int)hidx - (int)(pCVar2->scan).current_row_index;
    pTVar3 = (TryCast *)pCVar2->data[uVar10].lower;
    uVar4 = pCVar2->data[uVar10].upper;
    iVar9 = 0;
    input_01.upper = (int64_t)&local_60;
    input_01.lower = uVar4;
    bVar6 = TryCast::Operation<duckdb::hugeint_t,double>(pTVar3,input_01,(double *)0x0,(bool)strict)
    ;
    if (!bVar6) {
      pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_04.upper = iVar9;
      input_04.lower = uVar4;
      CastExceptionText<duckdb::hugeint_t,double>(&local_58,(duckdb *)pTVar3,input_04);
      InvalidInputException::InvalidInputException(pIVar8,(string *)&local_58);
      __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    dVar11 = this->RN -
             (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0));
    local_60 = dVar11 * local_60 + local_38 * (1.0 - dVar11);
  }
  return local_60;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}